

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void base_extent_bump_alloc_post
               (tsdn_t *tsdn,base_t *base,edata_t *edata,size_t gap_size,void *addr,size_t size)

{
  cache_bin_t *pcVar1;
  uint16_t *puVar2;
  
  if (*(long *)&base->ehooks_base == 0) {
    duckdb_je_edata_avail_insert
              ((edata_avail_t *)
               &tsdn[1].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins[0xf].
                tstats,(edata_t *)base);
  }
  else {
    base_edata_heap_insert(tsdn,base,edata);
  }
  if (((base->ehooks).ind & 0x10000) == 0) {
    pcVar1 = tsdn[1].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins + 0x10;
    pcVar1->stack_head = (void **)((long)pcVar1->stack_head + (long)addr);
    pcVar1 = tsdn[1].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins + 0x11;
    pcVar1->stack_head =
         (void **)((long)pcVar1->stack_head +
                  (((long)addr + gap_size + 0xfff & 0xfffffffffffff000) -
                  ((gap_size - (long)edata) + 0xfff & 0xfffffffffffff000)));
    if (((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
        (duckdb_je_init_system_thp_mode == thp_mode_default)) &&
       ((duckdb_je_opt_metadata_thp == metadata_thp_always ||
        (*(char *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena == '\x01'
        )))) {
      puVar2 = &tsdn[1].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins[0x11].
                low_bits_low_water;
      *(size_t *)puVar2 =
           *(long *)puVar2 +
           ((long)addr +
            (gap_size - ((gap_size - (long)edata) + 0x1fffff & 0xffffffffffe00000)) + 0x1fffff >>
           0x15);
    }
  }
  return;
}

Assistant:

static void
base_extent_bump_alloc_post(tsdn_t *tsdn, base_t *base, edata_t *edata,
    size_t gap_size, void *addr, size_t size) {
	if (edata_bsize_get(edata) > 0) {
		base_edata_heap_insert(tsdn, base, edata);
	} else {
		/* Freed base edata_t stored in edata_avail. */
		edata_avail_insert(&base->edata_avail, edata);
	}

	if (config_stats && !base_edata_is_reused(edata)) {
		base->allocated += size;
		/*
		 * Add one PAGE to base_resident for every page boundary that is
		 * crossed by the new allocation. Adjust n_thp similarly when
		 * metadata_thp is enabled.
		 */
		base->resident += PAGE_CEILING((uintptr_t)addr + size) -
		    PAGE_CEILING((uintptr_t)addr - gap_size);
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		if (metadata_thp_madvise() && (opt_metadata_thp ==
		    metadata_thp_always || base->auto_thp_switched)) {
			base->n_thp += (HUGEPAGE_CEILING((uintptr_t)addr + size)
			    - HUGEPAGE_CEILING((uintptr_t)addr - gap_size)) >>
			    LG_HUGEPAGE;
			assert(base->mapped >= base->n_thp << LG_HUGEPAGE);
		}
	}
}